

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biftrc(bifcxdef *ctx,int argc)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int in_ESI;
  long in_RDI;
  int flag;
  int n;
  runsdef val;
  int in_stack_ffffffffffffffbc;
  runcxdef *in_stack_ffffffffffffffc0;
  runsdef *val_00;
  dattyp in_stack_ffffffffffffffcc;
  runcxdef *in_stack_ffffffffffffffd0;
  
  if (in_ESI == 2) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) == '\b') {
      bVar3 = true;
    }
    else {
      if (**(char **)(*(long *)(in_RDI + 8) + 0x20) != '\x05') {
        *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
        runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      bVar3 = false;
    }
    if ((int)uVar2 != 1) {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "debugTrace";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (bVar3) {
      lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x70);
      *(byte *)(lVar1 + 0x119a) = *(byte *)(lVar1 + 0x119a) | 4;
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x70);
      *(byte *)(lVar1 + 0x119a) = *(byte *)(lVar1 + 0x119a) & 0xfb;
    }
  }
  else {
    val_00 = *(runsdef **)(in_RDI + 8);
    dbgstart(*(dbgcxdef **)(*(long *)(in_RDI + 8) + 0x68));
    runpush(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,val_00);
  }
  return;
}

Assistant:

void biftrc(bifcxdef *ctx, int argc)
{
    runsdef val;
    int     n;
    int     flag;

    if (argc == 2)
    {
        /* get the type indicator and the on/off status */
        n = runpopnum(ctx->bifcxrun);
        flag = runpoplog(ctx->bifcxrun);

        /* see what type of debugging they want to turn on or off */
        switch(n)
        {
        case 1:
            /* turn on parser tracing */
            if (flag)
                ctx->bifcxrun->runcxvoc->voccxflg |= VOCCXFDBG;
            else
                ctx->bifcxrun->runcxvoc->voccxflg &= ~VOCCXFDBG;
            break;

        default:
            /* ignore other requests */
            runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "debugTrace");
        }
    }
    else
    {
        /* break into debugger; return whether debugger is present */
        bifcntargs(ctx, 0, argc);
        runpush(ctx->bifcxrun, runclog(dbgstart(ctx->bifcxrun->runcxdbg)),
                &val);
    }
}